

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal,
          bool command_expand_lists,string *depfile)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  cmCustomCommand *pcVar5;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar6;
  cmGlobalGenerator *pcVar7;
  const_reference pvVar8;
  cmSourceFile *pcVar9;
  cmCustomCommandLines local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  cmCustomCommand *local_380;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends2;
  string local_358;
  cmSourceFile *local_338;
  cmSourceFile *out_1;
  string *o_1;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string local_308;
  cmSourceFile *local_2e8;
  cmSourceFile *out;
  string *o;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_2b8;
  int local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string outName;
  cmGlobalGenerator *gg;
  cmSourceFile *file;
  ostringstream local_1f0 [8];
  ostringstream e;
  cmCustomCommandLine *cl;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  bool command_expand_lists_local;
  bool uses_terminal_local;
  bool escapeOldStyle_local;
  bool replace_local;
  cmCustomCommandLines *commandLines_local;
  string *main_dependency_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmMakefile *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(outputs);
  if (bVar1) {
    cmSystemTools::Error
              ("Attempt to add a custom rule with no output!",(char *)0x0,(char *)0x0,(char *)0x0);
    this_local = (cmMakefile *)0x0;
  }
  else {
    __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin
                       (&commandLines->
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    cl = (cmCustomCommandLine *)
         std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end
                   (&commandLines->
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                       *)&cl), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                 ::operator*(&__end1)->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(this_00);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](this_00,0);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](this_00,0);
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)pvVar8);
          if (*pcVar2 == '\"') {
            std::__cxx11::ostringstream::ostringstream(local_1f0);
            poVar3 = std::operator<<((ostream *)local_1f0,
                                     "COMMAND may not contain literal quotes:\n  ");
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](this_00,0);
            poVar3 = std::operator<<(poVar3,(string *)pvVar8);
            std::operator<<(poVar3,"\n");
            std::__cxx11::ostringstream::str();
            IssueMessage(this,FATAL_ERROR,(string *)&file);
            std::__cxx11::string::~string((string *)&file);
            std::__cxx11::ostringstream::~ostringstream(local_1f0);
            return (cmSourceFile *)0x0;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
      ::operator++(&__end1);
    }
    gg = (cmGlobalGenerator *)0x0;
    bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                      (&commandLines->
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((!bVar1) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      gg = (cmGlobalGenerator *)GetSource(this,main_dependency,Ambiguous);
      if ((gg == (cmGlobalGenerator *)0x0) ||
         ((pcVar5 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg),
          pcVar5 == (cmCustomCommand *)0x0 || (replace)))) {
        if (gg == (cmGlobalGenerator *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,main_dependency,false,Ambiguous);
        }
      }
      else {
        pcVar5 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar6 = &cmCustomCommand::GetCommandLines(pcVar5)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar1 = std::operator==(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,pvVar6);
        if (bVar1) {
          return (cmSourceFile *)gg;
        }
        gg = (cmGlobalGenerator *)0x0;
      }
    }
    if (gg == (cmGlobalGenerator *)0x0) {
      pcVar7 = GetGlobalGenerator(this);
      outName.field_2._8_8_ = pcVar7;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](outputs,0);
      (*pcVar7->_vptr_cmGlobalGenerator[0x2b])((string *)local_250,pcVar7,pvVar8);
      gg = (cmGlobalGenerator *)GetSource(this,(string *)local_250,Known);
      if ((((cmMakefile *)gg == (cmMakefile *)0x0) ||
          (pcVar5 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg),
          pcVar5 == (cmCustomCommand *)0x0)) || (replace)) {
        if ((cmMakefile *)gg == (cmMakefile *)0x0) {
          gg = (cmGlobalGenerator *)CreateSource(this,(string *)local_250,true,Known);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"__CMAKE_RULE",(allocator<char> *)((long)&__range1_1 + 7));
        cmSourceFile::SetProperty((cmSourceFile *)gg,&local_2b8,"1");
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
        local_294 = 0;
      }
      else {
        pcVar5 = cmSourceFile::GetCustomCommand((cmSourceFile *)gg);
        pvVar6 = &cmCustomCommand::GetCommandLines(pcVar5)->
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
        bVar1 = std::operator!=(&commandLines->
                                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                ,pvVar6);
        if (bVar1) {
          std::operator+(&local_290,"Attempt to add a custom rule to output \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250);
          std::operator+(&local_270,&local_290,"\" which already has a custom rule.");
          cmSystemTools::Error(&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&local_290);
        }
        local_294 = 1;
        this_local = (cmMakefile *)gg;
      }
      std::__cxx11::string::~string((string *)local_250);
      if (local_294 != 0) {
        return (cmSourceFile *)this_local;
      }
    }
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(outputs);
    o = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(outputs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&o), bVar1) {
      out = (cmSourceFile *)
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_1);
      pcVar9 = GetOrCreateSource(this,(string *)out,true,Known);
      local_2e8 = pcVar9;
      if (pcVar9 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308,"GENERATED",(allocator<char> *)((long)&__range1_2 + 7));
        cmSourceFile::SetProperty(pcVar9,&local_308,"1");
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_2 + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    __end1_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(byproducts);
    o_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(byproducts);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_2,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&o_1), bVar1) {
      out_1 = (cmSourceFile *)
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_2);
      pcVar9 = GetOrCreateSource(this,(string *)out_1,true,Known);
      local_338 = pcVar9;
      if (pcVar9 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"GENERATED",
                   (allocator<char> *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmSourceFile::SetProperty(pcVar9,&local_358,"1");
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&depends2.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_2);
    }
    if (gg != (cmGlobalGenerator *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc,depends);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,main_dependency);
      }
      pcVar5 = (cmCustomCommand *)operator_new(0xf0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_398,outputs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3b0,byproducts);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cc);
      cmCustomCommandLines::cmCustomCommandLines(&local_3e0,commandLines);
      cmCustomCommand::cmCustomCommand
                (pcVar5,this,&local_398,&local_3b0,&local_3c8,&local_3e0,comment,workingDir);
      cmCustomCommandLines::~cmCustomCommandLines(&local_3e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_398);
      local_380 = pcVar5;
      cmCustomCommand::SetEscapeOldStyle(pcVar5,escapeOldStyle);
      cmCustomCommand::SetEscapeAllowMakeVars(local_380,true);
      cmCustomCommand::SetUsesTerminal(local_380,uses_terminal);
      cmCustomCommand::SetCommandExpandLists(local_380,command_expand_lists);
      cmCustomCommand::SetDepfile(local_380,depfile);
      cmSourceFile::SetCustomCommand((cmSourceFile *)gg,local_380);
      UpdateOutputToSourceMap(this,outputs,(cmSourceFile *)gg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cc);
    }
    this_local = (cmMakefile *)gg;
  }
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::AddCustomCommandToOutput(
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends, const std::string& main_dependency,
  const cmCustomCommandLines& commandLines, const char* comment,
  const char* workingDir, bool replace, bool escapeOldStyle,
  bool uses_terminal, bool command_expand_lists, const std::string& depfile)
{
  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return nullptr;
  }

  // Validate custom commands.  TODO: More strict?
  for (cmCustomCommandLine const& cl : commandLines) {
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return nullptr;
    }
  }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && !main_dependency.empty()) {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = this->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        cmSystemTools::Error("Attempt to add a custom rule to output \"" +
                             outName + "\" which already has a custom rule.");
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file =
        this->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Always create the output sources and mark them generated.
  for (std::string const& o : outputs) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }
  for (std::string const& o : byproducts) {
    if (cmSourceFile* out =
          this->GetOrCreateSource(o, true, cmSourceFileLocationKind::Known)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Attach the custom command to the file.
  if (file) {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if (!main_dependency.empty()) {
      depends2.push_back(main_dependency);
    }

    cmCustomCommand* cc = new cmCustomCommand(
      this, outputs, byproducts, depends2, commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    cc->SetCommandExpandLists(command_expand_lists);
    cc->SetDepfile(depfile);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
  }
  return file;
}